

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementGeneric.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementGeneric::ComputeGravityForces
          (ChElementGeneric *this,ChVectorDynamic<> *Fg,ChVector<double> *G_acc)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Index size;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar12;
  long lVar13;
  ActualDstType actualDst;
  double dVar14;
  shared_ptr<chrono::ChLoadableUVW> mloadable;
  shared_ptr<chrono::ChLoad<chrono::ChLoaderGravity>_> common_gravity_loader;
  undefined1 local_49;
  shared_ptr<chrono::ChLoadableUVW> local_48;
  ChLoad<chrono::ChLoaderGravity> *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  lVar13 = (Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar13 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar13 != 0) {
    memset((Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar13 << 3);
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x18);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00b5b800;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)this;
  local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__dynamic_cast(this,&typeinfo,&ChLoadableUVW::typeinfo,0xfffffffffffffffe);
  if (local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = 2;
    }
  }
  if (local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if ((((VNULL == G_acc->m_data[0]) && (!NAN(VNULL) && !NAN(G_acc->m_data[0]))) &&
        (DAT_00b90ac0 == G_acc->m_data[1])) && (!NAN(DAT_00b90ac0) && !NAN(G_acc->m_data[1]))) {
      if ((DAT_00b90ac8 == G_acc->m_data[2]) && (!NAN(DAT_00b90ac8) && !NAN(G_acc->m_data[2])))
      goto LAB_006aad12;
    }
    local_30 = (ChLoad<chrono::ChLoaderGravity> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChLoad<chrono::ChLoaderGravity>,std::allocator<chrono::ChLoad<chrono::ChLoaderGravity>>,std::shared_ptr<chrono::ChLoadableUVW>&>
              (&local_28,&local_30,(allocator<chrono::ChLoad<chrono::ChLoaderGravity>_> *)&local_49,
               &local_48);
    dVar14 = G_acc->m_data[2];
    dVar6 = G_acc->m_data[1];
    (local_30->loader).G_acc.m_data[0] = G_acc->m_data[0];
    (local_30->loader).G_acc.m_data[1] = dVar6;
    (local_30->loader).G_acc.m_data[2] = dVar14;
    (local_30->loader).num_int_points = 1;
    dVar14 = (double)(**(code **)((long)*local_48.
                                         super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + 0x70))();
    if ((dVar14 != 0.0) || (NAN(dVar14))) {
      (local_30->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
      super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(local_30->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
                  super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      (*(local_30->super_ChLoadBase).super_ChObj._vptr_ChObj[0xc])(local_30,0,0);
      pdVar3 = (local_30->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader.Q.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar12 = (local_30->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader.Q.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if ((Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
          uVar12) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar12,1);
      }
      uVar4 = (Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      if (uVar4 != uVar12) {
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                     );
      }
      pdVar5 = (Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar12 = uVar4 + 7;
      if (-1 < (long)uVar4) {
        uVar12 = uVar4;
      }
      uVar12 = uVar12 & 0xfffffffffffffff8;
      if (7 < (long)uVar4) {
        lVar13 = 0;
        do {
          pdVar1 = pdVar3 + lVar13;
          dVar14 = pdVar1[1];
          dVar6 = pdVar1[2];
          dVar7 = pdVar1[3];
          dVar8 = pdVar1[4];
          dVar9 = pdVar1[5];
          dVar10 = pdVar1[6];
          dVar11 = pdVar1[7];
          pdVar2 = pdVar5 + lVar13;
          *pdVar2 = *pdVar1;
          pdVar2[1] = dVar14;
          pdVar2[2] = dVar6;
          pdVar2[3] = dVar7;
          pdVar2[4] = dVar8;
          pdVar2[5] = dVar9;
          pdVar2[6] = dVar10;
          pdVar2[7] = dVar11;
          lVar13 = lVar13 + 8;
        } while (lVar13 < (long)uVar12);
      }
      if ((long)uVar12 < (long)uVar4) {
        do {
          pdVar5[uVar12] = pdVar3[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar4 != uVar12);
      }
    }
    if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
    }
  }
LAB_006aad12:
  if (local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void ChElementGeneric::ComputeGravityForces(ChVectorDynamic<>& Fg, const ChVector<>& G_acc) {

    // A default fall-back implementation of the ComputeGravityForces that will work for all elements
    // inherited from ChLoadableUVW and with nonzero GetDensity(). You might override with more efficient implementations.

    Fg.setZero();

    // A null deleter: this is a hack to wrap "this" raw ptr, but we really need this 
    // because the ChLoaderGravity needs it as a shared pointer
    std::shared_ptr<ChElementGeneric> this_wrapper{this, [](ChElementGeneric*){} }; 

    if (auto mloadable = std::dynamic_pointer_cast<ChLoadableUVW>(this_wrapper)) {
        if (G_acc != VNULL) {
                auto common_gravity_loader = chrono_types::make_shared<ChLoad<ChLoaderGravity>>(mloadable);
                common_gravity_loader->loader.Set_G_acc(G_acc);
                common_gravity_loader->loader.SetNumIntPoints(1); //// TODO n. gauss points as parameter?
                if (mloadable->GetDensity()) {
                    // temporary set loader target and compute generalized forces term
                    common_gravity_loader->loader.loadable = mloadable;
                    common_gravity_loader->ComputeQ(nullptr, nullptr);
                    Fg = common_gravity_loader->loader.Q;
                }
        }
    }
}